

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_sphere_of_plasma(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_sphere_of_plasma);
  if (bVar1) {
    send_to_char("You cannot create another sphere of plasma yet.\n\r",ch);
    return;
  }
  act("Rippling links of plasma join to form a massive sphere of plasma around you!",ch,(void *)0x0,
      (void *)0x0,3);
  act("Rippling links of plasma join to form a massive sphere of plasma around $n!",ch,(void *)0x0,
      (void *)0x0,0);
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.type = (short)sn;
  af.level = (short)level;
  af.location = 0;
  af.owner = ch;
  iVar2 = dice(level / 0xd,2);
  af.modifier = (short)iVar2;
  af.duration = (short)(level / 5);
  af.end_fun = sphere_of_plasma_end;
  af.pulse_fun = sphere_of_plasma_pulse;
  af.mod_name = 8;
  affect_to_char(ch,&af);
  die_follower(ch);
  return;
}

Assistant:

void spell_sphere_of_plasma(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_sphere_of_plasma))
	{
		send_to_char("You cannot create another sphere of plasma yet.\n\r", ch);
		return;
	}

	act("Rippling links of plasma join to form a massive sphere of plasma around you!", ch, nullptr, nullptr, TO_CHAR);
	act("Rippling links of plasma join to form a massive sphere of plasma around $n!", ch, nullptr, nullptr, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.owner = ch;
	af.location = 0;
	af.modifier = dice(level / 13, 2);
	af.duration = level / 5;
	af.end_fun = sphere_of_plasma_end;
	af.pulse_fun = sphere_of_plasma_pulse;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	die_follower(ch);
}